

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationAdvancedCase::iterate
          (BlendEquationAdvancedCase *this)

{
  GLenum *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GLenum *pGVar3;
  TestLog *pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  BlendEquationAdvancedCase *pBVar7;
  int iVar8;
  GLenum err;
  undefined4 extraout_var;
  GLuint buf;
  undefined4 *puVar9;
  undefined *puVar10;
  ulong uVar11;
  ulong uVar12;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  GLint local_ec;
  ScopedLogSection local_e8;
  string local_e0;
  string local_c0;
  CallLogWrapper local_a0;
  BlendEquationAdvancedCase *local_88;
  ResultCollector local_80;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_a0,(Functions *)CONCAT44(extraout_var,iVar8),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar4,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_ec = 0;
  local_a0.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_a0,0x8824,&local_ec);
  err = glu::CallLogWrapper::glGetError(&local_a0);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x575);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"AfterSettingCommon","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"After setting common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar4,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendEquation(&local_a0,0x9295);
  if (0 < local_ec) {
    iVar8 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_a0,0x8009,iVar8,0x9295,this->m_verifierType);
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_ec);
    if (0 < local_ec) {
      iVar8 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_a0,0x883d,iVar8,0x9295,this->m_verifierType);
        iVar8 = iVar8 + 1;
      } while (iVar8 < local_ec);
    }
  }
  tcu::TestLog::endSection(local_e8.m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"AfterSettingIndexed","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"After setting indexed","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar4,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_88 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_ec) {
    puVar9 = &DAT_00976fb0;
    uVar11 = 0;
    do {
      glu::CallLogWrapper::glBlendEquationi(&local_a0,(GLuint)uVar11,puVar9[(uVar11 / 0xf) * -0xf]);
      uVar11 = uVar11 + 1;
      puVar9 = puVar9 + 1;
    } while ((int)uVar11 < local_ec);
    if (0 < local_ec) {
      puVar9 = &DAT_00976fb0;
      uVar11 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_a0,0x8009,(int)uVar11,puVar9[(uVar11 / 0xf) * -0xf],
                   local_88->m_verifierType);
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 1;
      } while ((int)uVar11 < local_ec);
      if (0 < local_ec) {
        puVar9 = &DAT_00976fb0;
        uVar11 = 0;
        do {
          gls::StateQueryUtil::verifyStateIndexedInteger
                    (&local_80,&local_a0,0x883d,(int)uVar11,puVar9[(uVar11 / 0xf) * -0xf],
                     local_88->m_verifierType);
          uVar11 = uVar11 + 1;
          puVar9 = puVar9 + 1;
        } while ((int)uVar11 < local_ec);
      }
    }
  }
  tcu::TestLog::endSection(local_e8.m_log);
  pBVar7 = local_88;
  pTVar4 = ((local_88->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"AfterResettingIndexedWithCommon","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"After resetting indexed with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar4,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_ec) {
    puVar9 = &DAT_00976fb0;
    uVar11 = 0;
    do {
      glu::CallLogWrapper::glBlendEquationi(&local_a0,(GLuint)uVar11,puVar9[(uVar11 / 0xf) * -0xf]);
      uVar11 = uVar11 + 1;
      puVar9 = puVar9 + 1;
    } while ((int)uVar11 < local_ec);
  }
  glu::CallLogWrapper::glBlendEquation(&local_a0,0x9294);
  if (0 < local_ec) {
    iVar8 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_a0,0x8009,iVar8,0x9294,pBVar7->m_verifierType);
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_ec);
    if (0 < local_ec) {
      iVar8 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_a0,0x883d,iVar8,0x9294,pBVar7->m_verifierType);
        iVar8 = iVar8 + 1;
      } while (iVar8 < local_ec);
    }
  }
  tcu::TestLog::endSection(local_e8.m_log);
  pTVar4 = ((pBVar7->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"AfterResettingIndexedSeparateWithCommon","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"After resetting indexed separate with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar4,&local_e0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  puVar9 = &DAT_00976f90;
  puVar10 = &DAT_00976f94;
  uVar12 = 1;
  uVar11 = 0;
  while( true ) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar11;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar12;
    buf = (GLuint)uVar11;
    if (local_ec <= (int)buf) break;
    pGVar1 = (GLenum *)
             ((long)puVar9 +
             (SUB168(auVar5 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    uVar11 = uVar11 + 1;
    pGVar3 = (GLenum *)
             (puVar10 + (SUB168(auVar6 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    puVar9 = puVar9 + 1;
    puVar10 = puVar10 + 4;
    uVar12 = uVar12 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&local_a0,buf,*pGVar1,*pGVar3);
  }
  glu::CallLogWrapper::glBlendEquation(&local_a0,0x9298);
  pBVar7 = local_88;
  if (0 < local_ec) {
    iVar8 = 0;
    do {
      gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_a0,0x8009,iVar8,0x9298,pBVar7->m_verifierType);
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_ec);
    if (0 < local_ec) {
      iVar8 = 0;
      do {
        gls::StateQueryUtil::verifyStateIndexedInteger
                  (&local_80,&local_a0,0x883d,iVar8,0x9298,pBVar7->m_verifierType);
        iVar8 = iVar8 + 1;
      } while (iVar8 < local_ec);
    }
  }
  tcu::TestLog::endSection(local_e8.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(pBVar7->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_a0);
  return STOP;
}

Assistant:

BlendEquationAdvancedCase::IterateResult BlendEquationAdvancedCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	const deUint32 blendEquationAdvanced[] =
	{
		GL_MULTIPLY,
		GL_SCREEN,
		GL_OVERLAY,
		GL_DARKEN,
		GL_LIGHTEN,
		GL_COLORDODGE,
		GL_COLORBURN,
		GL_HARDLIGHT,
		GL_SOFTLIGHT,
		GL_DIFFERENCE,
		GL_EXCLUSION,
		GL_HSL_HUE,
		GL_HSL_SATURATION,
		GL_HSL_COLOR,
		GL_HSL_LUMINOSITY
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_SCREEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_SCREEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_SCREEN, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		gl.glBlendEquation(GL_MULTIPLY);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_MULTIPLY, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_MULTIPLY, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedSeparateWithCommon", "After resetting indexed separate with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_LIGHTEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_LIGHTEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_LIGHTEN, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}